

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::
check_regions_are_contiguous
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          container_type *regions)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  uint64_t uVar4;
  
  psVar3 = (regions->
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (regions->
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    uVar4 = 0;
    do {
      peVar2 = (psVar3->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar2->offset_ != uVar4) {
        assert_failed("region->offset () == p",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                      ,0xb4);
      }
      uVar4 = uVar4 + peVar2->size_;
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  return;
}

Assistant:

void region_builder<File, MemoryMapper>::check_regions_are_contiguous (
            container_type const & regions) {
#ifdef NDEBUG
            (void) regions;
#else
            // Check that the regions are contiguous and sorted.
            std::uint64_t p = 0;
            for (pstore::region::memory_mapper_ptr const & region : regions) {
                PSTORE_ASSERT (region->offset () == p);
                p += region->size ();
            }
#endif
        }